

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void update_mem_availability(gen_ctx_t gen_ctx,bitmap_t mem_av,bb_insn_t_conflict mem_bb_insn)

{
  char cVar1;
  MIR_insn_t pMVar2;
  size_t nb;
  int iVar3;
  mem_expr_t pmVar4;
  MIR_insn_t mem2;
  size_t nel;
  bitmap_iterator_t bi;
  size_t local_48;
  bitmap_iterator_t local_40;
  
  pMVar2 = mem_bb_insn->insn;
  if ((*(uint *)&pMVar2->field_0x18 & 0xfffffffc) != 0) {
    __assert_fail("move_code_p (mem_bb_insn->insn->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xda9,"void update_mem_availability(gen_ctx_t, bitmap_t, bb_insn_t)");
  }
  cVar1 = pMVar2->ops[0].field_0x8;
  mem2 = (MIR_insn_t)pMVar2->ops;
  if (cVar1 != '\v') {
    mem2 = pMVar2 + 1;
  }
  if (*(char *)&(mem2->insn_link).prev == '\v') {
    local_40.nbit = 0;
    local_40.bitmap = mem_av;
    while( true ) {
      iVar3 = bitmap_iterator_next(&local_40,&local_48);
      nb = local_48;
      if (iVar3 == 0) break;
      pmVar4 = VARR_mem_expr_tget(gen_ctx->gvn_ctx->mem_exprs,local_48);
      if (cVar1 == '\v') {
        iVar3 = may_mem_alias_p(pmVar4->insn->ops + (pmVar4->insn->ops[0].field_0x8 != '\v'),
                                (MIR_op_t *)mem2);
        if (iVar3 != 0) {
          bitmap_clear_bit_p(mem_av,nb);
        }
      }
    }
    bitmap_set_bit_p(mem_av,(ulong)mem_bb_insn->mem_index);
    return;
  }
  __assert_fail("mem_ref->mode == MIR_OP_VAR_MEM",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xdab,"void update_mem_availability(gen_ctx_t, bitmap_t, bb_insn_t)");
}

Assistant:

static void update_mem_availability (gen_ctx_t gen_ctx, bitmap_t mem_av, bb_insn_t mem_bb_insn) {
  size_t nel;
  bitmap_iterator_t bi;
  MIR_insn_t mem_insn;
  MIR_op_t *mem_ref = &mem_bb_insn->insn->ops[0];
  int ld_p;

  gen_assert (move_code_p (mem_bb_insn->insn->code));
  if ((ld_p = mem_ref->mode != MIR_OP_VAR_MEM)) mem_ref = &mem_bb_insn->insn->ops[1];
  gen_assert (mem_ref->mode == MIR_OP_VAR_MEM);
  FOREACH_BITMAP_BIT (bi, mem_av, nel) {
    mem_insn = VARR_GET (mem_expr_t, mem_exprs, nel)->insn;
    if (!ld_p
        && may_mem_alias_p (&mem_insn->ops[mem_insn->ops[0].mode == MIR_OP_VAR_MEM ? 0 : 1],
                            mem_ref))
      bitmap_clear_bit_p (mem_av, nel);
  }
  bitmap_set_bit_p (mem_av, mem_bb_insn->mem_index);
}